

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBreak * ParseBreak(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynNumber *number;
  undefined4 extraout_var;
  Lexeme *end;
  SynBreak *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_break) {
    ctx->currentLexeme = begin + 1;
    number = ParseNumber(ctx);
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_semicolon,"ERROR: break statement must be followed by \';\' or a constant");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynBreak *)CONCAT44(extraout_var,iVar1);
    end = ParseContext::Previous(ctx);
    SynBreak::SynBreak(this,begin,end,number);
  }
  else {
    this = (SynBreak *)0x0;
  }
  return this;
}

Assistant:

SynBreak* ParseBreak(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_break))
	{
		// Optional
		SynNumber *node = ParseNumber(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: break statement must be followed by ';' or a constant");

		return new (ctx.get<SynBreak>()) SynBreak(start, ctx.Previous(), node);
	}

	return NULL;
}